

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_16bit_3chan(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint16_t uVar10;
  long in_RDI;
  int x_2;
  int x_1;
  int x;
  int y;
  int linc2;
  int linc1;
  int linc0;
  int inc2;
  int inc1;
  int inc0;
  int h;
  int w;
  uint8_t *out2;
  uint8_t *out1;
  uint8_t *out0;
  uint16_t *in2;
  uint16_t *in1;
  uint16_t *in0;
  uint8_t *srcbuffer;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0xc);
  iVar2 = *(int *)(in_RDI + 0x2c);
  iVar3 = *(int *)(in_RDI + 100);
  iVar4 = *(int *)(*(long *)(in_RDI + 8) + 0x20);
  iVar5 = *(int *)(*(long *)(in_RDI + 8) + 0x50);
  iVar6 = *(int *)(*(long *)(in_RDI + 8) + 0x80);
  iVar7 = *(int *)(*(long *)(in_RDI + 8) + 0x24);
  iVar8 = *(int *)(*(long *)(in_RDI + 8) + 0x54);
  iVar9 = *(int *)(*(long *)(in_RDI + 8) + 0x84);
  local_30 = *(long *)(*(long *)(in_RDI + 8) + 0x28);
  local_38 = *(long *)(*(long *)(in_RDI + 8) + 0x58);
  local_40 = *(long *)(*(long *)(in_RDI + 8) + 0x88);
  for (local_64 = *(int *)(in_RDI + 0x60); local_64 < iVar2 - iVar3; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < iVar1; local_68 = local_68 + 1) {
      uVar10 = one_to_native16(0);
      *(uint16_t *)(local_30 + local_68 * iVar4) = uVar10;
    }
    for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
      uVar10 = one_to_native16(0);
      *(uint16_t *)(local_38 + local_6c * iVar5) = uVar10;
    }
    for (local_70 = 0; local_70 < iVar1; local_70 = local_70 + 1) {
      uVar10 = one_to_native16(0);
      *(uint16_t *)(local_40 + local_70 * iVar6) = uVar10;
    }
    local_30 = local_30 + iVar7;
    local_38 = local_38 + iVar8;
    local_40 = local_40 + iVar9;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             inc0, inc1, inc2;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}